

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool __thiscall re2::Regexp::ParseState::DoLeftParen(ParseState *this,StringPiece *name)

{
  int iVar1;
  Regexp *this_00;
  string *this_01;
  allocator<char> local_21;
  
  this_00 = (Regexp *)operator_new(0x28);
  Regexp(this_00,kRegexpCharClass|kRegexpEmptyMatch,this->flags_);
  iVar1 = this->ncap_ + 1;
  this->ncap_ = iVar1;
  (this_00->field_7).field_0.max_ = iVar1;
  if (name->data_ != (const_pointer)0x0) {
    this_01 = (string *)operator_new(0x20);
    std::__cxx11::string::string<re2::StringPiece,void>((string *)this_01,name,&local_21);
    (this_00->field_7).field_1.name_ = this_01;
  }
  PushRegexp(this,this_00);
  return true;
}

Assistant:

bool Regexp::ParseState::DoLeftParen(const StringPiece& name) {
  Regexp* re = new Regexp(kLeftParen, flags_);
  re->cap_ = ++ncap_;
  if (name.data() != NULL)
    re->name_ = new std::string(name);
  return PushRegexp(re);
}